

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O0

bool Granulator_UploadSample
               (int index,float *data,int numsamples,int numchannels,int samplerate,char *name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  GranulatorSample *pGVar4;
  ulong uVar5;
  float *pfVar6;
  int local_b0;
  int local_ac;
  int i;
  int n;
  float *dst;
  float *src;
  double integrator [8];
  int num;
  GranulatorSample *s;
  MutexScopeLock mutexScope;
  char *name_local;
  int samplerate_local;
  int numchannels_local;
  int numsamples_local;
  float *data_local;
  int index_local;
  
  if ((index < 0) || (0xf < index)) {
    data_local._7_1_ = false;
  }
  else {
    mutexScope.mutex = (Mutex *)name;
    MutexScopeLock::MutexScopeLock((MutexScopeLock *)&s,(Mutex *)Granulator::sampleMutex,true);
    pGVar4 = Granulator::GetGranulatorSample(index);
    if (pGVar4->allocated != 0) {
      if (pGVar4->data != (float *)0x0) {
        operator_delete__(pGVar4->data);
      }
      if (pGVar4->preview != (float *)0x0) {
        operator_delete__(pGVar4->preview);
      }
    }
    iVar3 = numsamples * numchannels;
    if (iVar3 < 1) {
      pGVar4->data = (float *)0x0;
      pGVar4->preview = (float *)0x0;
      pGVar4->allocated = 0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar3;
      uVar5 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pfVar6 = (float *)operator_new__(uVar5);
      pGVar4->data = pfVar6;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)iVar3;
      uVar5 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pfVar6 = (float *)operator_new__(uVar5);
      pGVar4->preview = pfVar6;
      pGVar4->allocated = 1;
      strcpy(pGVar4->name,(char *)mutexScope.mutex);
      memcpy(pGVar4->data,data,(long)iVar3 << 2);
      memset(&src,0,0x40);
      dst = pGVar4->data;
      _i = pGVar4->preview;
      for (local_ac = 0; local_ac < numsamples; local_ac = local_ac + 1) {
        for (local_b0 = 0; local_b0 < numchannels; local_b0 = local_b0 + 1) {
          integrator[(long)local_b0 + -1] =
               integrator[(long)local_b0 + -1] * 0.9998999834060669 + (double)ABS(*dst);
          *_i = (float)integrator[(long)local_b0 + -1];
          _i = _i + 1;
          dst = dst + 1;
        }
      }
    }
    pGVar4->numsamples = numsamples;
    pGVar4->numchannels = numchannels;
    pGVar4->samplerate = samplerate;
    Granulator::globalupdatecount = Granulator::globalupdatecount + 1;
    pGVar4->updatecount = Granulator::globalupdatecount;
    data_local._7_1_ = true;
    MutexScopeLock::~MutexScopeLock((MutexScopeLock *)&s);
  }
  return data_local._7_1_;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API bool Granulator_UploadSample(int index, float* data, int numsamples, int numchannels, int samplerate, const char* name)
{
    if (index < 0 || index >= Granulator::MAXSAMPLE)
        return false;

    MutexScopeLock mutexScope(Granulator::sampleMutex);

    Granulator::GranulatorSample& s = Granulator::GetGranulatorSample(index);
    if (s.allocated)
    {
        delete[] s.data;
        delete[] s.preview;
    }

    int num = numsamples * numchannels;
    if (num > 0)
    {
        s.data = new float[num];
        s.preview = new float[num];
        s.allocated = 1;
        strcpy(s.name, name);
        memcpy(s.data, data, num * sizeof(float));
        double integrator[8]; memset(integrator, 0, sizeof(integrator));
        float* src = s.data;
        float* dst = s.preview;
        for (int n = 0; n < numsamples; n++)
        {
            for (int i = 0; i < numchannels; i++)
            {
                // Calculate full integrated signal for better reconstruction in GetFloatBufferCallback.
                // The small leak of 0.1% prevents build-up of DC.
                integrator[i] = integrator[i] * 0.9999f + fabsf(*src++);
                *dst++ = integrator[i];
            }
        }
    }
    else
    {
        s.data = NULL;
        s.preview = NULL;
        s.allocated = 0;
    }

    s.numsamples = numsamples;
    s.numchannels = numchannels;
    s.samplerate = samplerate;
    s.updatecount = ++Granulator::globalupdatecount;

    return true;
}